

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O2

int cm_zlib_deflateParams(z_streamp strm,int level,int strategy)

{
  deflate_state *s;
  Posf *__s;
  int iVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  
  iVar1 = deflateStateCheck(strm);
  iVar3 = -2;
  if (iVar1 == 0) {
    uVar4 = 6;
    if (level != -1) {
      uVar4 = level;
    }
    if ((uint)strategy < 5 && uVar4 < 10) {
      s = strm->state;
      if ((((s->strategy == strategy) &&
           (configuration_table[s->level].func == configuration_table[uVar4].func)) ||
          (s->last_flush == -2)) ||
         (((iVar1 = cm_zlib_deflate(strm,5), iVar1 != -2 && (iVar3 = -5, strm->avail_in == 0)) &&
          ((ulong)s->lookahead + ((ulong)s->strstart - s->block_start) == 0)))) {
        if (s->level != uVar4) {
          if ((s->level == 0) && (s->matches != 0)) {
            if (s->matches == 1) {
              slide_hash(s);
            }
            else {
              __s = s->head;
              uVar2 = (ulong)(s->hash_size - 1);
              __s[uVar2] = 0;
              memset(__s,0,uVar2 * 2);
            }
            s->matches = 0;
          }
          s->level = uVar4;
          s->max_lazy_match = (uint)configuration_table[uVar4].max_lazy;
          s->good_match = (uint)configuration_table[uVar4].good_length;
          s->nice_match = (uint)configuration_table[uVar4].nice_length;
          s->max_chain_length = (uint)configuration_table[uVar4].max_chain;
        }
        s->strategy = strategy;
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int ZEXPORT deflateParams(z_streamp strm, int level, int strategy) {
    deflate_state *s;
    compress_func func;

    if (deflateStateCheck(strm)) return Z_STREAM_ERROR;
    s = strm->state;

#ifdef FASTEST
    if (level != 0) level = 1;
#else
    if (level == Z_DEFAULT_COMPRESSION) level = 6;
#endif
    if (level < 0 || level > 9 || strategy < 0 || strategy > Z_FIXED) {
        return Z_STREAM_ERROR;
    }
    func = configuration_table[s->level].func;

    if ((strategy != s->strategy || func != configuration_table[level].func) &&
        s->last_flush != -2) {
        /* Flush the last buffer: */
        int err = deflate(strm, Z_BLOCK);
        if (err == Z_STREAM_ERROR)
            return err;
        if (strm->avail_in || (s->strstart - s->block_start) + s->lookahead)
            return Z_BUF_ERROR;
    }
    if (s->level != level) {
        if (s->level == 0 && s->matches != 0) {
            if (s->matches == 1)
                slide_hash(s);
            else
                CLEAR_HASH(s);
            s->matches = 0;
        }
        s->level = level;
        s->max_lazy_match   = configuration_table[level].max_lazy;
        s->good_match       = configuration_table[level].good_length;
        s->nice_match       = configuration_table[level].nice_length;
        s->max_chain_length = configuration_table[level].max_chain;
    }
    s->strategy = strategy;
    return Z_OK;
}